

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O3

REF_STATUS ref_clump_tri_around(REF_GRID_conflict ref_grid,REF_INT node,char *filename)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  FILE *__s;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  REF_INT cell;
  REF_DICT node_dict;
  REF_INT local;
  REF_DICT tri_dict;
  REF_DBL xyz_phys [3];
  REF_DBL xyz_comp [3];
  REF_INT nodes [27];
  REF_DBL m [6];
  REF_DBL jacob [9];
  REF_DICT local_178;
  int local_16c;
  REF_DICT local_168;
  long local_160;
  double local_158;
  double local_150;
  double local_148;
  REF_DBL local_138;
  undefined8 local_130;
  undefined8 local_128;
  REF_INT local_118 [28];
  REF_DBL local_a8 [6];
  REF_DBL local_78 [9];
  
  ref_cell = ref_grid->cell[3];
  uVar4 = ref_dict_create(&local_178);
  if (uVar4 == 0) {
    uVar4 = ref_dict_create(&local_168);
    if (uVar4 == 0) {
      if (((node < 0) || (pRVar1 = ref_cell->ref_adj, pRVar1->nnode <= node)) ||
         (lVar6 = (long)pRVar1->first[(uint)node], lVar6 == -1)) {
LAB_001e75f7:
        __s = fopen(filename,"w");
        if (__s == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x18c,"ref_clump_tri_around","unable to open file");
          return 2;
        }
        fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
        fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
        fprintf(__s,"zone t=\"clump\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)(uint)local_178->n,(ulong)(uint)local_168->n,"point","fequadrilateral");
        uVar4 = ref_node_metric_get(ref_grid->node,node,local_a8);
        if (uVar4 == 0) {
          uVar4 = ref_matrix_jacob_m(local_a8,local_78);
          if (uVar4 == 0) {
            if (0 < local_178->n) {
              lVar9 = (long)(node * 0xf);
              lVar6 = 0;
              do {
                local_16c = local_178->key[lVar6];
                lVar5 = (long)local_16c;
                pRVar3 = ref_grid->node->real;
                local_158 = pRVar3[lVar5 * 0xf] - pRVar3[lVar9];
                local_150 = pRVar3[lVar5 * 0xf + 1] - pRVar3[lVar9 + 1];
                local_148 = pRVar3[lVar5 * 0xf + 2] - pRVar3[lVar9 + 2];
                uVar4 = ref_matrix_vect_mult(local_78,&local_158,&local_138);
                if (uVar4 != 0) {
                  pcVar8 = "ax";
                  uVar7 = 0x1a0;
                  goto LAB_001e7516;
                }
                fprintf(__s," %.16e %.16e %.16e\n",local_138,local_130,local_128);
                lVar6 = lVar6 + 1;
              } while (lVar6 < local_178->n);
            }
            if (0 < local_168->n) {
              lVar6 = 0;
              do {
                uVar4 = ref_cell_nodes(ref_cell,local_168->key[lVar6],local_118);
                if (uVar4 != 0) {
                  pcVar8 = "n";
                  uVar7 = 0x1a6;
                  goto LAB_001e7516;
                }
                if (0 < ref_cell->node_per) {
                  lVar9 = 0;
                  do {
                    uVar4 = ref_dict_location(local_178,local_118[lVar9],&local_16c);
                    if (uVar4 != 0) {
                      pcVar8 = "ret";
                      uVar7 = 0x1a8;
                      goto LAB_001e7516;
                    }
                    fprintf(__s," %d",(ulong)(local_16c + 1));
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < ref_cell->node_per);
                }
                uVar4 = ref_dict_location(local_178,local_118[0],&local_16c);
                if (uVar4 != 0) {
                  pcVar8 = "ret";
                  uVar7 = 0x1ab;
                  goto LAB_001e7516;
                }
                fprintf(__s," %d",(ulong)(local_16c + 1));
                fputc(10,__s);
                lVar6 = lVar6 + 1;
              } while (lVar6 < local_168->n);
            }
            fclose(__s);
            uVar4 = ref_dict_free(local_168);
            if (uVar4 == 0) {
              uVar4 = ref_dict_free(local_178);
              if (uVar4 == 0) {
                return 0;
              }
              pcVar8 = "free nodes";
              uVar7 = 0x1b3;
            }
            else {
              pcVar8 = "free tris";
              uVar7 = 0x1b2;
            }
          }
          else {
            pcVar8 = "jac";
            uVar7 = 0x197;
          }
        }
        else {
          pcVar8 = "get";
          uVar7 = 0x196;
        }
      }
      else {
        cell = pRVar1->item[lVar6].ref;
        local_160 = lVar6;
        while (uVar4 = ref_cell_nodes(ref_cell,cell,local_118), uVar4 == 0) {
          uVar4 = ref_dict_store(local_168,cell,0);
          if (uVar4 != 0) {
            pcVar8 = "store";
            uVar7 = 0x185;
            goto LAB_001e7516;
          }
          if (0 < ref_cell->node_per) {
            lVar6 = 0;
            do {
              uVar4 = ref_dict_store(local_178,local_118[lVar6],0);
              if (uVar4 != 0) {
                pcVar8 = "store";
                uVar7 = 0x187;
                goto LAB_001e7516;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < ref_cell->node_per);
          }
          pRVar2 = ref_cell->ref_adj->item;
          lVar6 = (long)pRVar2[(int)local_160].next;
          if (lVar6 == -1) goto LAB_001e75f7;
          cell = pRVar2[lVar6].ref;
          local_160 = lVar6;
        }
        pcVar8 = "n";
        uVar7 = 0x184;
      }
    }
    else {
      pcVar8 = "create tris";
      uVar7 = 0x181;
    }
  }
  else {
    pcVar8 = "create nodes";
    uVar7 = 0x180;
  }
LAB_001e7516:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar7,
         "ref_clump_tri_around",(ulong)uVar4,pcVar8);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_clump_tri_around(REF_GRID ref_grid, REF_INT node,
                                        const char *filename) {
  REF_DICT node_dict, tri_dict;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT local;
  REF_DBL xyz_comp[3], xyz_phys[3];
  REF_DBL m[6], jacob[9];

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(tri_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\"\n");

  fprintf(
      f,
      "zone t=\"clump\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      ref_dict_n(node_dict), ref_dict_n(tri_dict), "point", "fequadrilateral");

  RSS(ref_node_metric_get(ref_grid_node(ref_grid), node, m), "get");
  RSS(ref_matrix_jacob_m(m, jacob), "jac");
  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 0, node);
    xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 1, node);
    xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 2, node);
    RSS(ref_matrix_vect_mult(jacob, xyz_phys, xyz_comp), "ax");
    fprintf(f, " %.16e %.16e %.16e\n", xyz_comp[0], xyz_comp[1], xyz_comp[2]);
  }

  for (item = 0; item < ref_dict_n(tri_dict); item++) {
    cell = ref_dict_key(tri_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    RSS(ref_dict_location(node_dict, nodes[0], &local), "ret");
    fprintf(f, " %d", local + 1);
    fprintf(f, "\n");
  }

  fclose(f);

  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}